

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall
QPDF::writeJSON(QPDF *this,int version,Pipeline *p,bool complete,bool *first_key,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               string *file_prefix,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *wanted_objects)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int id;
  runtime_error *this_00;
  Writer *pWVar4;
  size_t __val;
  reference this_01;
  size_type sVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  string_view sVar7;
  QPDFObjectHandle local_228;
  byte local_213;
  byte local_212;
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  Stream stream;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string key;
  QPDFObjGen og;
  QPDFObjectHandle *obj;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_f0 [6];
  bool first;
  bool all_objects;
  string_view local_d0;
  string local_c0;
  string_view local_a0;
  string local_90;
  string_view local_70;
  undefined1 local_60 [8];
  Writer jw;
  qpdf_stream_decode_level_e decode_level_local;
  bool *first_key_local;
  bool complete_local;
  Pipeline *p_local;
  int version_local;
  QPDF *this_local;
  
  if (version != 2) {
    this_00 = (runtime_error *)
              __cxa_allocate_exception
                        (0x10,CONCAT44(in_register_00000034,version),p,json_stream_data);
    std::runtime_error::runtime_error(this_00,"QPDF::writeJSON: only version 2 is supported");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  JSON::Writer::Writer((Writer *)local_60,p,4);
  if (complete) {
    JSON::Writer::operator<<((Writer *)local_60,"{");
  }
  else if ((*first_key & 1U) == 0) {
    JSON::Writer::operator<<((Writer *)local_60,",");
  }
  *first_key = false;
  pWVar4 = JSON::Writer::operator<<
                     ((Writer *)local_60,"\n  \"qpdf\": [\n    {\n      \"jsonversion\": ");
  std::__cxx11::to_string(&local_90,2);
  local_70 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  pWVar4 = JSON::Writer::operator<<(pWVar4,local_70);
  pWVar4 = JSON::Writer::operator<<(pWVar4,",\n      \"pdfversion\": \"");
  getPDFVersion_abi_cxx11_(&local_c0,this);
  local_a0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c0);
  pWVar4 = JSON::Writer::operator<<(pWVar4,local_a0);
  pWVar4 = JSON::Writer::operator<<(pWVar4,"\",\n      \"pushedinheritedpageresources\": ");
  bVar1 = everPushedInheritedAttributesToPages(this);
  pcVar6 = "false";
  if (bVar1) {
    pcVar6 = "true";
  }
  pWVar4 = JSON::Writer::operator<<(pWVar4,pcVar6);
  pWVar4 = JSON::Writer::operator<<(pWVar4,",\n      \"calledgetallpages\": ");
  bVar1 = everCalledGetAllPages(this);
  pcVar6 = "false";
  if (bVar1) {
    pcVar6 = "true";
  }
  pWVar4 = JSON::Writer::operator<<(pWVar4,pcVar6);
  pWVar4 = JSON::Writer::operator<<(pWVar4,",\n      \"maxobjectid\": ");
  __val = getObjectCount(this);
  std::__cxx11::to_string((string *)local_f0,__val);
  local_d0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f0);
  pWVar4 = JSON::Writer::operator<<(pWVar4,local_d0);
  JSON::Writer::operator<<(pWVar4,"\n    },\n    {");
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_90);
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(wanted_objects);
  bVar1 = true;
  getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1,this);
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  obj = (QPDFObjectHandle *)
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&obj);
    if (!bVar3) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
      local_212 = 0;
      local_213 = 0;
      bVar3 = true;
      if (!bVar2) {
        std::allocator<char>::allocator();
        local_212 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"trailer",&local_211);
        local_213 = 1;
        sVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(wanted_objects,&local_210);
        bVar3 = sVar5 != 0;
      }
      if ((local_213 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_210);
      }
      if ((local_212 & 1) != 0) {
        std::allocator<char>::~allocator(&local_211);
      }
      if (bVar3) {
        if (!bVar1) {
          JSON::Writer::operator<<((Writer *)local_60,"\n      },");
        }
        JSON::Writer::operator<<((Writer *)local_60,"\n      \"trailer\": {\n        \"value\": ");
        getTrailer((QPDF *)&local_228);
        QPDFObjectHandle::writeJSON(&local_228,2,(Writer *)local_60,true);
        QPDFObjectHandle::~QPDFObjectHandle(&local_228);
        bVar1 = false;
      }
      if (!bVar1) {
        JSON::Writer::operator<<((Writer *)local_60,"\n      }");
      }
      JSON::Writer::operator<<((Writer *)local_60,"\n    }\n  ]");
      if (complete) {
        JSON::Writer::operator<<((Writer *)local_60,"\n}\n");
        (*p->_vptr_Pipeline[3])();
      }
      return;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator*(&__end1);
    key.field_2._8_8_ = QPDFObjectHandle::getObjGen(this_01);
    QPDFObjGen::unparse_abi_cxx11_(&local_198,(QPDFObjGen *)((long)&key.field_2 + 8),' ');
    std::operator+(&local_178,"obj:",&local_198);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178," R");
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    if (bVar2) {
LAB_0035a399:
      if (bVar1) {
        pWVar4 = JSON::Writer::operator<<((Writer *)local_60,"\n      \"");
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_158);
        JSON::Writer::operator<<(pWVar4,sVar7);
        bVar1 = false;
      }
      else {
        pWVar4 = JSON::Writer::operator<<((Writer *)local_60,"\n      },\n      \"");
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_158);
        stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar7._M_len;
        JSON::Writer::operator<<(pWVar4,sVar7);
      }
      QPDFObjectHandle::as_stream((QPDFObjectHandle *)local_1c8,(typed)this_01);
      bVar3 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_1c8);
      if (bVar3) {
        JSON::Writer::operator<<((Writer *)local_60,"\": {\n        \"stream\": ");
        if (json_stream_data == qpdf_sj_file) {
          id = QPDFObjGen::getObj((QPDFObjGen *)((long)&key.field_2 + 8));
          writeJSONStreamFile(2,(Writer *)local_60,(Stream *)local_1c8,id,decode_level,file_prefix);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
          ::qpdf::Stream::writeStreamJSON
                    ((Stream *)local_1c8,2,(Writer *)local_60,json_stream_data,decode_level,
                     (Pipeline *)0x0,&local_1e8,false);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator(&local_1e9);
        }
      }
      else {
        JSON::Writer::operator<<((Writer *)local_60,"\": {\n        \"value\": ");
        QPDFObjectHandle::writeJSON(this_01,2,(Writer *)local_60,true);
      }
      ::qpdf::Stream::~Stream((Stream *)local_1c8);
    }
    else {
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(wanted_objects,(key_type *)local_158);
      if (sVar5 != 0) goto LAB_0035a399;
    }
    std::__cxx11::string::~string((string *)local_158);
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void
QPDF::writeJSON(
    int version,
    Pipeline* p,
    bool complete,
    bool& first_key,
    qpdf_stream_decode_level_e decode_level,
    qpdf_json_stream_data_e json_stream_data,
    std::string const& file_prefix,
    std::set<std::string> wanted_objects)
{
    if (version != 2) {
        throw std::runtime_error("QPDF::writeJSON: only version 2 is supported");
    }
    JSON::Writer jw{p, 4};
    if (complete) {
        jw << "{";
    } else if (!first_key) {
        jw << ",";
    }
    first_key = false;

    /* clang-format off */
    jw << "\n"
          "  \"qpdf\": [\n"
          "    {\n"
          "      \"jsonversion\": " << std::to_string(version) << ",\n"
          "      \"pdfversion\": \"" << getPDFVersion() << "\",\n"
          "      \"pushedinheritedpageresources\": " <<  (everPushedInheritedAttributesToPages() ? "true" : "false") << ",\n"
          "      \"calledgetallpages\": " <<  (everCalledGetAllPages() ? "true" : "false") << ",\n"
          "      \"maxobjectid\": " <<  std::to_string(getObjectCount()) << "\n"
          "    },\n"
          "    {";
    /* clang-format on */

    bool all_objects = wanted_objects.empty();
    bool first = true;
    for (auto& obj: getAllObjects()) {
        auto const og = obj.getObjGen();
        std::string key = "obj:" + og.unparse(' ') + " R";
        if (all_objects || wanted_objects.count(key)) {
            if (first) {
                jw << "\n      \"" << key;
                first = false;
            } else {
                jw << "\n      },\n      \"" << key;
            }
            if (auto stream = obj.as_stream()) {
                jw << "\": {\n        \"stream\": ";
                if (json_stream_data == qpdf_sj_file) {
                    writeJSONStreamFile(
                        version, jw, stream, og.getObj(), decode_level, file_prefix);
                } else {
                    stream.writeStreamJSON(
                        version, jw, json_stream_data, decode_level, nullptr, "");
                }
            } else {
                jw << "\": {\n        \"value\": ";
                obj.writeJSON(version, jw, true);
            }
        }
    }
    if (all_objects || wanted_objects.count("trailer")) {
        if (!first) {
            jw << "\n      },";
        }
        jw << "\n      \"trailer\": {\n        \"value\": ";
        getTrailer().writeJSON(version, jw, true);
        first = false;
    }
    if (!first) {
        jw << "\n      }";
    }
    /* clang-format off */
    jw << "\n"
          "    }\n"
          "  ]";
    /* clang-format on */
    if (complete) {
        jw << "\n}\n";
        p->finish();
    }
}